

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O2

cmCMakePath * __thiscall cmCMakePath::ReplaceWideExtension(cmCMakePath *this,cmCMakePath *extension)

{
  cmCMakePath *pcVar1;
  string_view extension_00;
  string local_30;
  
  std::filesystem::__cxx11::path::string(&local_30,&extension->Path);
  extension_00._M_str = local_30._M_dataplus._M_p;
  extension_00._M_len = local_30._M_string_length;
  pcVar1 = ReplaceWideExtension(this,extension_00);
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar1;
}

Assistant:

cmCMakePath& ReplaceWideExtension(
    const cmCMakePath& extension = cmCMakePath())
  {
    return this->ReplaceWideExtension(
      static_cast<cm::string_view>(extension.Path.string()));
  }